

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O0

ON_PolylineCurve * __thiscall
ON_PolylineCurve::operator=(ON_PolylineCurve *this,ON_3dPointArray *src)

{
  int count_00;
  double *pdVar1;
  int local_20;
  int i;
  int count;
  ON_3dPointArray *src_local;
  ON_PolylineCurve *this_local;
  
  ON_Polyline::operator=(&this->m_pline,src);
  this->m_dim = 3;
  count_00 = ON_SimpleArray<ON_3dPoint>::Count(&src->super_ON_SimpleArray<ON_3dPoint>);
  ON_SimpleArray<double>::Reserve(&this->m_t,(long)count_00);
  ON_SimpleArray<double>::SetCount(&this->m_t,count_00);
  for (local_20 = 0; local_20 < count_00; local_20 = local_20 + 1) {
    pdVar1 = ON_SimpleArray<double>::operator[](&this->m_t,local_20);
    *pdVar1 = (double)local_20;
  }
  return this;
}

Assistant:

ON_PolylineCurve& ON_PolylineCurve::operator=( const ON_3dPointArray& src )
{
  m_pline = src;
  m_dim   = 3;
  const int count = src.Count();
  m_t.Reserve(count);
  m_t.SetCount(count);
  int i;
  for (i = 0; i < count; i++) {
    m_t[i] = (double)i;
  }
  return *this;
}